

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

int read_inter_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,int preskip,aom_reader *r)

{
  aom_cdf_prob *paVar1;
  ushort uVar2;
  ushort uVar3;
  MB_MODE_INFO *pMVar4;
  FRAME_CONTEXT *pFVar5;
  short sVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  int mi_offset;
  uint8_t *puVar12;
  uint x_mis;
  long lVar13;
  uint y_mis;
  ulong uVar14;
  uint8_t *puVar15;
  aom_cdf_prob (*icdf) [3];
  
  pMVar4 = *xd->mi;
  iVar7 = (cm->mi_params).mi_cols;
  x_mis = iVar7 - xd->mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar4->bsize] <= (int)x_mis) {
    x_mis = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [pMVar4->bsize];
  }
  y_mis = (cm->mi_params).mi_rows - xd->mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [pMVar4->bsize] <= (int)y_mis) {
    y_mis = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [pMVar4->bsize];
  }
  uVar14 = (ulong)y_mis;
  if ((cm->seg).enabled == '\0') {
    return 0;
  }
  mi_offset = xd->mi_row * iVar7 + xd->mi_col;
  if ((cm->seg).update_map == '\0') {
    puVar12 = cm->last_frame_seg_map;
    puVar15 = cm->cur_frame->seg_map;
    lVar11 = (long)(cm->mi_params).mi_cols;
    if (puVar12 == (uint8_t *)0x0) {
      if (0 < (int)y_mis) {
        uVar14 = (ulong)y_mis;
        puVar15 = puVar15 + mi_offset;
        do {
          memset(puVar15,0,(long)(int)x_mis);
          puVar15 = puVar15 + lVar11;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
    }
    else if (0 < (int)y_mis) {
      lVar13 = (long)mi_offset;
      uVar14 = (ulong)y_mis;
      do {
        memcpy(puVar15 + lVar13,puVar12 + lVar13,(long)(int)x_mis);
        lVar13 = lVar13 + lVar11;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
    iVar7 = get_predicted_segment_id(cm,mi_offset,x_mis,y_mis);
    return iVar7;
  }
  if (preskip == 0) {
    if (pMVar4->skip_txfm != '\0') {
      if ((cm->seg).temporal_update != '\0') {
        pMVar4->field_0xa7 = pMVar4->field_0xa7 & 0xf7;
      }
      uVar8 = read_segment_id(cm,xd,r,1);
      if (0 < (int)y_mis) {
        puVar12 = cm->cur_frame->seg_map + mi_offset;
        do {
          memset(puVar12,uVar8 & 0xff,(long)(int)x_mis);
          puVar12 = puVar12 + iVar7;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      goto LAB_0017dedd;
    }
  }
  else if ((cm->seg).segid_preskip == '\0') {
    return 0;
  }
  if ((cm->seg).temporal_update == '\0') {
LAB_0017de8f:
    uVar8 = read_segment_id(cm,xd,r,0);
  }
  else {
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar14 = 0;
    }
    else {
      uVar14 = (ulong)(*(ushort *)&xd->above_mbmi->field_0xa7 >> 3 & 1);
    }
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)(*(ushort *)&xd->left_mbmi->field_0xa7 >> 3 & 1);
    }
    lVar11 = uVar10 + uVar14;
    pFVar5 = xd->tile_ctx;
    icdf = (pFVar5->seg).pred_cdf + lVar11;
    uVar8 = od_ec_decode_cdf_q15(&r->ec,*icdf,2);
    if (r->allow_update_cdf != '\0') {
      uVar2 = (pFVar5->seg).pred_cdf[lVar11][2];
      bVar9 = (char)(uVar2 >> 4) + 4;
      uVar3 = (*icdf)[0];
      if ((char)uVar8 < '\x01') {
        sVar6 = -(uVar3 >> (bVar9 & 0x1f));
      }
      else {
        sVar6 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar9 & 0x1f));
      }
      (*icdf)[0] = sVar6 + uVar3;
      paVar1 = (pFVar5->seg).pred_cdf[lVar11] + 2;
      *paVar1 = *paVar1 + (ushort)(uVar2 < 0x20);
    }
    *(ushort *)&pMVar4->field_0xa7 =
         (*(ushort *)&pMVar4->field_0xa7 & 0xfff7) + (short)(uVar8 & 1) * 8;
    if ((uVar8 & 1) == 0) goto LAB_0017de8f;
    uVar8 = get_predicted_segment_id(cm,mi_offset,x_mis,y_mis);
  }
  if (0 < (int)y_mis) {
    puVar12 = cm->cur_frame->seg_map + mi_offset;
    uVar14 = (ulong)y_mis;
    do {
      memset(puVar12,uVar8 & 0xff,(long)(int)x_mis);
      puVar12 = puVar12 + iVar7;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
LAB_0017dedd:
  return uVar8 & 0xff;
}

Assistant:

static int read_inter_segment_id(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                 int preskip, aom_reader *r) {
  struct segmentation *const seg = &cm->seg;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_offset = mi_row * mi_params->mi_cols + mi_col;
  const int bw = mi_size_wide[mbmi->bsize];
  const int bh = mi_size_high[mbmi->bsize];

  // TODO(slavarnway): move x_mis, y_mis into xd ?????
  const int x_mis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int y_mis = AOMMIN(mi_params->mi_rows - mi_row, bh);

  if (!seg->enabled) return 0;  // Default for disabled segmentation

  if (!seg->update_map) {
    copy_segment_id(mi_params, cm->last_frame_seg_map, cm->cur_frame->seg_map,
                    mi_offset, x_mis, y_mis);
    return get_predicted_segment_id(cm, mi_offset, x_mis, y_mis);
  }

  uint8_t segment_id;
  const int mi_stride = cm->mi_params.mi_cols;
  if (preskip) {
    if (!seg->segid_preskip) return 0;
  } else {
    if (mbmi->skip_txfm) {
      if (seg->temporal_update) {
        mbmi->seg_id_predicted = 0;
      }
      segment_id = read_segment_id(cm, xd, r, 1);
      set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                     segment_id);
      return segment_id;
    }
  }

  if (seg->temporal_update) {
    const uint8_t ctx = av1_get_pred_context_seg_id(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    struct segmentation_probs *const segp = &ec_ctx->seg;
    aom_cdf_prob *pred_cdf = segp->pred_cdf[ctx];
    mbmi->seg_id_predicted = aom_read_symbol(r, pred_cdf, 2, ACCT_STR);
    if (mbmi->seg_id_predicted) {
      segment_id = get_predicted_segment_id(cm, mi_offset, x_mis, y_mis);
    } else {
      segment_id = read_segment_id(cm, xd, r, 0);
    }
  } else {
    segment_id = read_segment_id(cm, xd, r, 0);
  }
  set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                 segment_id);
  return segment_id;
}